

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Hinge::dim_forward
          (Dim *__return_storage_ptr__,Hinge *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  Dim *d;
  bool bVar1;
  ostream *os;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  string local_1b0 [32];
  ostringstream s;
  
  d = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)d == 0x24) {
    bVar1 = LooksLikeVector(d);
    if (bVar1) {
      _s = 1;
      x._M_len = 1;
      x._M_array = (iterator)&s;
      Dim::Dim(__return_storage_ptr__,x,
               ((xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_start)->bd);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Bad input dimensions in Hinge: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Hinge::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || !LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in Hinge: " << xs;
    throw std::invalid_argument(s.str());
  }
  return Dim({1}, xs[0].bd);
}